

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void fs_write_alotof_bufs_with_offset(int add_flags)

{
  uint len;
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uv_buf_t *bufs;
  long off;
  void *__ptr;
  uv_buf_t uVar5;
  char *local_98;
  size_t local_90;
  char *local_88;
  size_t local_80;
  char *local_78;
  size_t local_70;
  char *local_68;
  size_t local_60;
  int filler_len;
  char *filler;
  int64_t offset;
  ulong uStack_38;
  int r;
  size_t index;
  char *buffer;
  uv_buf_t *iovs;
  size_t iovmax;
  size_t iovcount;
  int add_flags_local;
  
  sVar4 = strlen("0123456789");
  len = (uint)sVar4;
  iovmax = 0xd431;
  unlink("test_file");
  loop = uv_default_loop();
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xca0,"iovs != NULL");
    abort();
  }
  iVar1 = uv_test_getiovmax();
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",add_flags | 0x42,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xca9,"r >= 0");
    abort();
  }
  if (open_req1.result < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xcaa,"open_req1.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&open_req1);
  uVar5 = uv_buf_init("0123456789",len);
  local_68 = uVar5.base;
  iov.base = local_68;
  local_60 = uVar5.len;
  iov.len = local_60;
  uVar3 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
  ;
  if (uVar3 != len) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xcaf,"r == filler_len");
    abort();
  }
  if (write_req.result != (int)len) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xcb0,"write_req.result == filler_len");
    abort();
  }
  uv_fs_req_cleanup(&write_req);
  off = (long)(int)uVar3;
  for (uStack_38 = 0; uStack_38 < 0xd431; uStack_38 = uStack_38 + 1) {
    uVar5 = uv_buf_init(test_buf,0xd);
    local_78 = uVar5.base;
    bufs[uStack_38].base = local_78;
    local_70 = uVar5.len;
    bufs[uStack_38].len = local_70;
  }
  iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,bufs,0xd431,off,
                      (uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xcbe,"r >= 0");
    abort();
  }
  if (write_req.result != 0xac67d) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xcbf,"(size_t)write_req.result == sizeof(test_buf) * iovcount");
    abort();
  }
  uv_fs_req_cleanup(&write_req);
  __ptr = malloc(0xac67d);
  if (__ptr != (void *)0x0) {
    for (uStack_38 = 0; uStack_38 < 0xd431; uStack_38 = uStack_38 + 1) {
      uVar5 = uv_buf_init((char *)((long)__ptr + uStack_38 * 0xd),0xd);
      local_88 = uVar5.base;
      bufs[uStack_38].base = local_88;
      local_80 = uVar5.len;
      bufs[uStack_38].len = local_80;
    }
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,bufs,0xd431,off,
                       (uv_fs_cb)0x0);
    if (iVar2 < 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xccc,"r >= 0");
      abort();
    }
    if (iVar2 == 0xd) {
      iovmax = 1;
    }
    else if ((ulong)(long)iVar1 < 0xd431) {
      iovmax = (long)iVar1;
    }
    if (read_req.result != iovmax * 0xd) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xcd1,"(size_t)read_req.result == sizeof(test_buf) * iovcount");
      abort();
    }
    for (uStack_38 = 0; uStack_38 < iovmax; uStack_38 = uStack_38 + 1) {
      iVar1 = strncmp((char *)((long)__ptr + uStack_38 * 0xd),test_buf,0xd);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
                ,0xcd6,"strncmp(buffer + index * sizeof(test_buf), test_buf, sizeof(test_buf)) == 0"
               );
        abort();
      }
    }
    uv_fs_req_cleanup(&read_req);
    free(__ptr);
    iVar1 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xcdc,"r == 0");
      abort();
    }
    if (*(long *)((long)stat_req.ptr + 0x38) != off + write_req.result) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xcde,
              "(int64_t)((uv_stat_t*)stat_req.ptr)->st_size == offset + (int64_t)write_req.result");
      abort();
    }
    uv_fs_req_cleanup(&stat_req);
    uVar5 = uv_buf_init(buf,0x20);
    local_98 = uVar5.base;
    iov.base = local_98;
    local_90 = uVar5.len;
    iov.len = local_90;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       off + write_req.result,(uv_fs_cb)0x0);
    if (iVar1 == 0) {
      if (read_req.result != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
                ,0xcea,"read_req.result == 0");
        abort();
      }
      uv_fs_req_cleanup(&read_req);
      iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
      if (iVar1 == 0) {
        if (close_req.result == 0) {
          uv_fs_req_cleanup(&close_req);
          unlink("test_file");
          free(bufs);
          return;
        }
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
                ,0xcef,"close_req.result == 0");
        abort();
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xcee,"r == 0");
      abort();
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xce9,"r == 0");
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,0xcc4,"buffer != NULL");
  abort();
}

Assistant:

static void fs_write_alotof_bufs_with_offset(int add_flags) {
  size_t iovcount;
  size_t iovmax;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;
  int r;
  int64_t offset;
  char* filler;
  int filler_len;

  filler = "0123456789";
  filler_len = strlen(filler);
  iovcount = 54321;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT(iovs != NULL);
  iovmax = uv_test_getiovmax();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT | add_flags,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(filler, filler_len);
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r == filler_len);
  ASSERT(write_req.result == filler_len);
  uv_fs_req_cleanup(&write_req);
  offset = (int64_t)r;

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(test_buf, sizeof(test_buf));

  r = uv_fs_write(NULL,
                  &write_req,
                  open_req1.result,
                  iovs,
                  iovcount,
                  offset,
                  NULL);
  ASSERT(r >= 0);
  ASSERT((size_t)write_req.result == sizeof(test_buf) * iovcount);
  uv_fs_req_cleanup(&write_req);

  /* Read the strings back to separate buffers. */
  buffer = malloc(sizeof(test_buf) * iovcount);
  ASSERT(buffer != NULL);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf),
                              sizeof(test_buf));

  r = uv_fs_read(NULL, &read_req, open_req1.result,
                 iovs, iovcount, offset, NULL);
  ASSERT(r >= 0);
  if (r == sizeof(test_buf))
    iovcount = 1; /* Infer that preadv is not available. */
  else if (iovcount > iovmax)
    iovcount = iovmax;
  ASSERT((size_t)read_req.result == sizeof(test_buf) * iovcount);

  for (index = 0; index < iovcount; ++index)
    ASSERT(strncmp(buffer + index * sizeof(test_buf),
                   test_buf,
                   sizeof(test_buf)) == 0);

  uv_fs_req_cleanup(&read_req);
  free(buffer);

  r = uv_fs_stat(NULL, &stat_req, "test_file", NULL);
  ASSERT(r == 0);
  ASSERT((int64_t)((uv_stat_t*)stat_req.ptr)->st_size ==
         offset + (int64_t)write_req.result);
  uv_fs_req_cleanup(&stat_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL,
                 &read_req,
                 open_req1.result,
                 &iov,
                 1,
                 offset + write_req.result,
                 NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  free(iovs);
}